

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_test.cc
# Opt level: O2

void re2::NamedCapturesErrorArgs(void)

{
  bool bVar1;
  Regexp *pRVar2;
  RegexpStatus status;
  RegexpStatus local_1a8;
  LogMessageFatal local_188;
  
  local_1a8.code_ = kRegexpSuccess;
  local_1a8.error_arg_.ptr_ = (char *)0x0;
  local_1a8.error_arg_.length_ = 0;
  local_1a8.tmp_ = (string *)0x0;
  local_188.super_LogMessage._0_8_ = "test(?P<name";
  local_188.super_LogMessage._8_4_ = 0xc;
  pRVar2 = Regexp::Parse((StringPiece *)&local_188,LikePerl,&local_1a8);
  if (pRVar2 != (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d0);
    std::operator<<((ostream *)&local_188.super_LogMessage.str_,"Check failed: re == NULL");
    LogMessageFatal::~LogMessageFatal(&local_188);
  }
  if (local_1a8.code_ != kRegexpBadNamedCapture) {
    LogMessageFatal::LogMessageFatal
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d1);
    std::operator<<((ostream *)&local_188.super_LogMessage.str_,
                    "Check failed: (status.code()) == (kRegexpBadNamedCapture)");
    LogMessageFatal::~LogMessageFatal(&local_188);
  }
  local_188.super_LogMessage._0_8_ = "(?P<name";
  local_188.super_LogMessage._8_4_ = 8;
  bVar1 = StringPiece::_equal(&local_1a8.error_arg_,(StringPiece *)&local_188);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d2);
    std::operator<<((ostream *)&local_188.super_LogMessage.str_,
                    "Check failed: (status.error_arg()) == (\"(?P<name\")");
    LogMessageFatal::~LogMessageFatal(&local_188);
  }
  local_188.super_LogMessage._0_8_ = "test(?P<space bar>z)";
  local_188.super_LogMessage._8_4_ = 0x14;
  pRVar2 = Regexp::Parse((StringPiece *)&local_188,LikePerl,&local_1a8);
  if (pRVar2 != (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d5);
    std::operator<<((ostream *)&local_188.super_LogMessage.str_,"Check failed: re == NULL");
    LogMessageFatal::~LogMessageFatal(&local_188);
  }
  if (local_1a8.code_ != kRegexpBadNamedCapture) {
    LogMessageFatal::LogMessageFatal
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d6);
    std::operator<<((ostream *)&local_188.super_LogMessage.str_,
                    "Check failed: (status.code()) == (kRegexpBadNamedCapture)");
    LogMessageFatal::~LogMessageFatal(&local_188);
  }
  local_188.super_LogMessage._0_8_ = "(?P<space bar>";
  local_188.super_LogMessage._8_4_ = 0xe;
  bVar1 = StringPiece::_equal(&local_1a8.error_arg_,(StringPiece *)&local_188);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/parse_test.cc"
               ,0x1d7);
    std::operator<<((ostream *)&local_188.super_LogMessage.str_,
                    "Check failed: (status.error_arg()) == (\"(?P<space bar>\")");
    LogMessageFatal::~LogMessageFatal(&local_188);
  }
  RegexpStatus::~RegexpStatus(&local_1a8);
  return;
}

Assistant:

TEST(NamedCaptures, ErrorArgs) {
  RegexpStatus status;
  Regexp* re;

  re = Regexp::Parse("test(?P<name", Regexp::LikePerl, &status);
  EXPECT_TRUE(re == NULL);
  EXPECT_EQ(status.code(), kRegexpBadNamedCapture);
  EXPECT_EQ(status.error_arg(), "(?P<name");

  re = Regexp::Parse("test(?P<space bar>z)", Regexp::LikePerl, &status);
  EXPECT_TRUE(re == NULL);
  EXPECT_EQ(status.code(), kRegexpBadNamedCapture);
  EXPECT_EQ(status.error_arg(), "(?P<space bar>");
}